

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

char * candidateSignal(int which)

{
  int which_local;
  char *local_8;
  
  switch(which) {
  case 0:
    local_8 = "2textValueSelected(QString)";
    break;
  case 1:
    local_8 = "2intValueSelected(int)";
    break;
  case 2:
    local_8 = "2doubleValueSelected(double)";
    break;
  case 3:
  }
  return local_8;
}

Assistant:

static const char *candidateSignal(int which)
{
    switch (CandidateSignal(which)) {
    case TextValueSelectedSignal:   return SIGNAL(textValueSelected(QString));
    case IntValueSelectedSignal:    return SIGNAL(intValueSelected(int));
    case DoubleValueSelectedSignal: return SIGNAL(doubleValueSelected(double));

    case NumCandidateSignals:
        break;
    };
    Q_UNREACHABLE_RETURN(nullptr);
}